

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ImplicitNonAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitNonAnsiPortSyntax,slang::syntax::ImplicitNonAnsiPortSyntax_const&>
          (BumpAllocator *this,ImplicitNonAnsiPortSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  PortExpressionSyntax *pPVar3;
  undefined4 uVar4;
  ImplicitNonAnsiPortSyntax *pIVar5;
  
  pIVar5 = (ImplicitNonAnsiPortSyntax *)allocate(this,0x20,8);
  uVar4 = *(undefined4 *)&(args->super_NonAnsiPortSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_NonAnsiPortSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_NonAnsiPortSyntax).super_SyntaxNode.previewNode;
  pPVar3 = (args->expr).ptr;
  (pIVar5->super_NonAnsiPortSyntax).super_SyntaxNode.kind =
       (args->super_NonAnsiPortSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar5->super_NonAnsiPortSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pIVar5->super_NonAnsiPortSyntax).super_SyntaxNode.parent = pSVar1;
  (pIVar5->super_NonAnsiPortSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pIVar5->expr).ptr = pPVar3;
  return pIVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }